

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> * __thiscall
amrex::BoxArray::intersections(BoxArray *this,Box *bx)

{
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *in_RDI;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *isects;
  IntVect *in_stack_00000588;
  undefined1 in_stack_00000597;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
  *in_stack_00000598;
  Box *in_stack_000005a0;
  BoxArray *in_stack_000005a8;
  IntVect local_c;
  
  std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
            ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             0xfc92c6);
  IntVect::IntVect(&local_c,0);
  intersections(in_stack_000005a8,in_stack_000005a0,in_stack_00000598,(bool)in_stack_00000597,
                in_stack_00000588);
  return in_RDI;
}

Assistant:

std::vector< std::pair<int,Box> >
BoxArray::intersections (const Box& bx) const
{
    std::vector< std::pair<int,Box> > isects;
    intersections(bx,isects,false,IntVect::TheZeroVector());
    return isects;
}